

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rstarplanner.cpp
# Opt level: O1

void __thiscall RSTARPlanner::InitializeSearchStateInfo(RSTARPlanner *this,RSTARState *state)

{
  RSTARSearchStateSpace_t *pRVar1;
  pointer ppCVar2;
  int iVar3;
  
  state->g = 1000000000;
  state->iterationclosed = 0;
  pRVar1 = this->pSearchStateSpace;
  state->callnumberaccessed = pRVar1->callnumber;
  (state->super_AbstractSearchState).heapindex = 0;
  state->bestpredaction = (CMDPACTION *)0x0;
  if (pRVar1->searchgoalstate == (CMDPSTATE *)0x0) {
    iVar3 = 0;
  }
  else {
    iVar3 = ComputeHeuristic(this,state->MDPstate);
  }
  state->h = iVar3;
  ppCVar2 = (state->predactionV).super__Vector_base<CMDPACTION_*,_std::allocator<CMDPACTION_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((state->predactionV).super__Vector_base<CMDPACTION_*,_std::allocator<CMDPACTION_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppCVar2) {
    (state->predactionV).super__Vector_base<CMDPACTION_*,_std::allocator<CMDPACTION_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppCVar2;
  }
  return;
}

Assistant:

void RSTARPlanner::InitializeSearchStateInfo(RSTARState* state)
{
    state->g = INFINITECOST;
    state->iterationclosed = 0;
    state->callnumberaccessed = pSearchStateSpace->callnumber;
    state->heapindex = 0;
    state->bestpredaction = NULL;

    //compute heuristics
#if USE_HEUR
    if(pSearchStateSpace->searchgoalstate != NULL)
    state->h = ComputeHeuristic(state->MDPstate);
    else
    state->h = 0;
#else
    state->h = 0;
#endif

    state->predactionV.clear();
}